

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

void cft_fasttext_free(fasttext_t *handle)

{
  FastText *in_RDI;
  FastText *x;
  
  if (in_RDI != (FastText *)0x0) {
    fasttext::FastText::~FastText(in_RDI);
    operator_delete(in_RDI);
  }
  return;
}

Assistant:

void cft_fasttext_free(fasttext_t* handle) {
    FastText* x = (FastText*)handle;
    delete x;
}